

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::StringMaker<wchar_t_const*,void>::convert_abi_cxx11_(wchar_t *str)

{
  wchar_t *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff78;
  allocator local_4d [20];
  allocator local_39 [17];
  wstring local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (wchar_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"{null string}",local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_28,in_RSI,local_39);
    Detail::stringify<std::__cxx11::wstring>(in_stack_ffffffffffffff78);
    std::__cxx11::wstring::~wstring(local_28);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)local_39);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string StringMaker<wchar_t const*>::convert(wchar_t const * str) {
    if (str) {
        return ::Catch::Detail::stringify(std::wstring{ str });
    } else {
        return{ "{null string}" };
    }
}